

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::AddPackage
          (DescriptorBuilder *this,string *name,Message *proto,FileDescriptor *file)

{
  Tables *this_00;
  char *__s1;
  _Node **pp_Var1;
  ulong uVar2;
  DescriptorBuilder *this_01;
  Message *descriptor;
  bool bVar3;
  int iVar4;
  long lVar5;
  string *name_00;
  ulong uVar6;
  long *plVar7;
  FileDescriptor *pFVar8;
  Symbol *pSVar9;
  long *plVar10;
  size_type *psVar11;
  char cVar12;
  _Node *p_Var13;
  char *pcVar14;
  _Node *p_Var15;
  Symbol symbol;
  Symbol existing_symbol;
  string local_d0;
  DescriptorBuilder *local_b0;
  Message *local_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  Symbol local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  symbol.field_1.package_file_descriptor = file;
  symbol._0_8_ = 7;
  bVar3 = DescriptorPool::Tables::AddSymbol(this->tables_,name,symbol);
  local_b0 = this;
  if (bVar3) {
    lVar5 = std::__cxx11::string::rfind((char)name,0x2e);
    if (lVar5 == -1) {
      ValidateSymbolName(this,name,name,proto);
      return;
    }
    this_00 = this->tables_;
    std::__cxx11::string::substr((ulong)&local_d0,(ulong)name);
    name_00 = DescriptorPool::Tables::AllocateString(this_00,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    this_01 = local_b0;
    AddPackage(local_b0,name_00,proto,file);
    std::__cxx11::string::substr((ulong)&local_d0,(ulong)name);
    ValidateSymbolName(this_01,&local_d0,name,proto);
    local_50.field_2._M_allocated_capacity = local_d0.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_d0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p == &local_d0.field_2) {
      return;
    }
  }
  else {
    __s1 = (name->_M_dataplus)._M_p;
    cVar12 = *__s1;
    if (cVar12 == '\0') {
      uVar6 = 0;
    }
    else {
      uVar6 = 0;
      pcVar14 = __s1;
      do {
        pcVar14 = pcVar14 + 1;
        uVar6 = (long)cVar12 + uVar6 * 5;
        cVar12 = *pcVar14;
      } while (cVar12 != '\0');
    }
    pp_Var1 = (this->tables_->symbols_by_name_).
              super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
              .
              super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
              .
              super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
              ._M_buckets;
    uVar2 = (this->tables_->symbols_by_name_).
            super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
            .
            super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
            .
            super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
            ._M_bucket_count;
    p_Var13 = pp_Var1[uVar6 % uVar2];
    p_Var15 = (_Node *)0x0;
    local_a8 = proto;
    if (p_Var13 != (_Node *)0x0) {
      do {
        iVar4 = strcmp(__s1,(p_Var13->_M_v).first);
        p_Var15 = p_Var13;
        if (iVar4 == 0) break;
        p_Var13 = p_Var13->_M_next;
        p_Var15 = (_Node *)0x0;
      } while (p_Var13 !=
               (_Hash_node<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
                *)0x0);
    }
    if (p_Var15 == (_Node *)0x0) {
      p_Var15 = pp_Var1[uVar2];
    }
    pSVar9 = &(p_Var15->_M_v).second;
    if (p_Var15 == pp_Var1[uVar2]) {
      pSVar9 = (Symbol *)&(anonymous_namespace)::kNullSymbol;
    }
    local_60.field_1 = pSVar9->field_1;
    local_60.type = pSVar9->type;
    if (local_60.type == PACKAGE) {
      return;
    }
    std::operator+(&local_50,"\"",name);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
    descriptor = local_a8;
    plVar10 = plVar7 + 2;
    if ((long *)*plVar7 == plVar10) {
      local_90 = *plVar10;
      lStack_88 = plVar7[3];
      local_a0 = &local_90;
    }
    else {
      local_90 = *plVar10;
      local_a0 = (long *)*plVar7;
    }
    local_98 = plVar7[1];
    *plVar7 = (long)plVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    pFVar8 = anon_unknown_1::Symbol::GetFile(&local_60);
    plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_a0,**(ulong **)pFVar8);
    plVar10 = plVar7 + 2;
    if ((long *)*plVar7 == plVar10) {
      local_70 = *plVar10;
      lStack_68 = plVar7[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar10;
      local_80 = (long *)*plVar7;
    }
    local_78 = plVar7[1];
    *plVar7 = (long)plVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_80);
    psVar11 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_d0.field_2._M_allocated_capacity = *psVar11;
      local_d0.field_2._8_8_ = plVar7[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar11;
      local_d0._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_d0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    AddError(local_b0,name,descriptor,NAME,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if (local_a0 != &local_90) {
      operator_delete(local_a0,local_90 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return;
    }
  }
  operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void DescriptorBuilder::AddPackage(
    const string& name, const Message& proto, const FileDescriptor* file) {
  if (tables_->AddSymbol(name, Symbol(file))) {
    // Success.  Also add parent package, if any.
    string::size_type dot_pos = name.find_last_of('.');
    if (dot_pos == string::npos) {
      // No parents.
      ValidateSymbolName(name, name, proto);
    } else {
      // Has parent.
      string* parent_name = tables_->AllocateString(name.substr(0, dot_pos));
      AddPackage(*parent_name, proto, file);
      ValidateSymbolName(name.substr(dot_pos + 1), name, proto);
    }
  } else {
    Symbol existing_symbol = tables_->FindSymbol(name);
    // It's OK to redefine a package.
    if (existing_symbol.type != Symbol::PACKAGE) {
      // Symbol seems to have been defined in a different file.
      AddError(name, proto, DescriptorPool::ErrorCollector::NAME,
               "\"" + name + "\" is already defined (as something other than "
               "a package) in file \"" + existing_symbol.GetFile()->name() +
               "\".");
    }
  }
}